

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O0

size_t __thiscall
CCharmapToUniSB_basic::read_file
          (CCharmapToUniSB_basic *this,CVmDataSource *fp,char *buf,size_t bufl)

{
  int iVar1;
  size_t sVar2;
  ulong in_RCX;
  long *in_RSI;
  long *in_RDI;
  size_t inlen;
  ulong local_28;
  undefined1 local_20 [8];
  undefined1 local_18 [24];
  
  local_28 = in_RCX / 3;
  if (0x200 < local_28) {
    local_28 = 0x200;
  }
  iVar1 = (**(code **)(*in_RSI + 0x18))(in_RSI,(long)in_RDI + 0xc,local_28);
  sVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,local_18,local_20,(long)in_RDI + 0xc,(long)iVar1);
  return sVar2;
}

Assistant:

size_t CCharmapToUniSB_basic::read_file(CVmDataSource *fp,
                                        char *buf, size_t bufl)
{
    size_t inlen;

    /* 
     *   Compute how much to read from the file.  The input file is
     *   composed of single-byte characters, so only read up to one third
     *   of the buffer length; this will ensure that we can always fit
     *   what we read into the caller's buffer.  
     */
    inlen = bufl / 3;

    /* in any case, we can't read more than our own buffer size */
    if (inlen > sizeof(inbuf_))
        inlen = sizeof(inbuf_);

    /* read from the file */
    inlen = fp->readc(inbuf_, inlen);

    /* 
     *   Map data to the caller's buffer, and return the result.  We're
     *   certain that the data will fit in the caller's buffer: we're
     *   mapping only a third as many characters as we have bytes
     *   available, and each character can take up at most three bytes,
     *   hence the worst case is that we fill the buffer completely.
     *   
     *   On the other hand, we may only fill the buffer to a third of its
     *   capacity, but this is okay too, since we're not required to give
     *   the caller everything they asked for.  
     */
    return map(&buf, &bufl, inbuf_, inlen);
}